

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ScanfFunc::checkArguments
          (ScanfFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  SourceLocation this_00;
  reference ppEVar2;
  ASTContext *in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  SourceLocation in_RSI;
  ASTContext *in_RDI;
  SystemSubroutine *in_R8;
  SourceLocation in_R9;
  Compilation *comp;
  Type *pTVar3;
  ASTContext *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  DiagCode code;
  SystemSubroutine *in_stack_ffffffffffffff80;
  Type *in_stack_ffffffffffffff88;
  SourceLocation arg;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar4;
  Args *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 isMethod;
  ASTContext *min;
  Type *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff70 >> 0x20,0);
  isMethod = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  min = in_RDI;
  this_00 = (SourceLocation)ASTContext::getCompilation((ASTContext *)0xb22131);
  pTVar3 = (Type *)0x7fffffff;
  callRange.endLoc = in_R9;
  callRange.startLoc = this_00;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_R8,in_RCX,(bool)isMethod,in_stack_ffffffffffffffa0,callRange,(size_t)min,
                     (size_t)in_RCX);
  if (bVar1) {
    if (((ulong)in_RDI[1].scope.ptr & 1) == 0) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb22241)
      ;
      bVar1 = Type::canBeStringLike(pTVar3);
      if (!bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        sourceRange.endLoc = in_stack_ffffffffffffff68;
        sourceRange.startLoc = in_RSI;
        ASTContext::addDiag(in_stack_ffffffffffffff58,code,sourceRange);
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        not_null<const_slang::ast::Type_*>::operator*
                  ((not_null<const_slang::ast::Type_*> *)0xb222c8);
        ast::operator<<((Diagnostic *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
        pTVar3 = Compilation::getErrorType((Compilation *)this_00);
        return pTVar3;
      }
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb221d6)
      ;
      bVar1 = Type::isIntegral(pTVar3);
      if (!bVar1) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0)
        ;
        pTVar3 = SystemSubroutine::badArg(in_stack_ffffffffffffff80,in_RDI,(Expression *)in_RSI);
        return pTVar3;
      }
    }
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xb2230f);
    bVar1 = Type::canBeStringLike(pTVar3);
    if (bVar1) {
      local_8 = Compilation::getIntegerType((Compilation *)this_00);
    }
    else {
      uVar4 = 0x1b000b;
      ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,1);
      arg = ((*ppEVar2)->sourceRange).endLoc;
      sourceRange_00.endLoc = in_stack_ffffffffffffff68;
      sourceRange_00.startLoc = in_stack_ffffffffffffff60;
      ASTContext::addDiag(in_stack_ffffffffffffff58,code,sourceRange_00);
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1);
      not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xb22398);
      ast::operator<<((Diagnostic *)CONCAT44(uVar4,in_stack_ffffffffffffff90),(Type *)arg);
      local_8 = Compilation::getErrorType((Compilation *)this_00);
    }
  }
  else {
    local_8 = Compilation::getErrorType((Compilation *)this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 2, INT32_MAX))
            return comp.getErrorType();

        // First argument is an fd or a string.
        if (isFscanf) {
            if (!args[0]->type->isIntegral())
                return badArg(context, *args[0]);
        }
        else {
            if (!args[0]->type->canBeStringLike()) {
                context.addDiag(diag::InvalidStringArg, args[0]->sourceRange) << *args[0]->type;
                return comp.getErrorType();
            }
        }

        // Second arg is a format string.
        if (!args[1]->type->canBeStringLike()) {
            context.addDiag(diag::InvalidStringArg, args[1]->sourceRange) << *args[1]->type;
            return comp.getErrorType();
        }

        // TODO: add some compile-time checking of the format string here
        return comp.getIntegerType();
    }